

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# posix_ipclisten.c
# Opt level: O2

int ipc_listener_get_listen_fd(void *arg,void *buf,size_t *szp,nni_type t)

{
  int iVar1;
  
  nni_mtx_lock((nni_mtx *)((long)arg + 0x140));
  if (*(char *)((long)arg + 0x128) == '\0') {
    nni_panic("%s: %d: assert err: %s",
              "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/platform/posix/posix_ipclisten.c"
              ,0x12d,"l->started");
  }
  if (*(char *)((long)arg + 0x129) == '\x01') {
    nni_panic("%s: %d: assert err: %s",
              "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/platform/posix/posix_ipclisten.c"
              ,0x12e,"!l->closed");
  }
  iVar1 = nni_posix_pfd_fd((nni_posix_pfd *)((long)arg + 0x50));
  iVar1 = nni_copyout_int(iVar1,buf,szp,t);
  nni_mtx_unlock((nni_mtx *)((long)arg + 0x140));
  return iVar1;
}

Assistant:

static int
ipc_listener_get_listen_fd(void *arg, void *buf, size_t *szp, nni_type t)
{
	int           rv;
	ipc_listener *l = arg;

	nni_mtx_lock(&l->mtx);
	NNI_ASSERT(l->started);
	NNI_ASSERT(!l->closed);
	rv = nni_copyout_int(nni_posix_pfd_fd(&l->pfd), buf, szp, t);
	nni_mtx_unlock(&l->mtx);
	return (rv);
}